

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

Value * duckdb::Value::MinimumValue(Value *__return_storage_ptr__,LogicalType *type)

{
  PhysicalType PVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  byte width;
  uint8_t scale;
  date_t dVar5;
  timestamp_tz_t value;
  timestamp_t tVar6;
  InvalidTypeException *this;
  InternalException *this_00;
  string_t *in_RDX;
  int64_t value_00;
  undefined1 auVar7 [16];
  hugeint_t value_01;
  hugeint_t value_02;
  hugeint_t value_03;
  timestamp_ms_t result;
  LogicalType local_88;
  Value local_70;
  
  switch(type->id_) {
  case SQLNULL:
  case INTEGER:
    INTEGER(__return_storage_ptr__,-0x80000000);
    break;
  case UNKNOWN:
  case ANY:
  case USER:
  case USER|SQLNULL:
  case USER|UNKNOWN:
  case USER|ANY:
  case 8:
  case 9:
  case CHAR:
  case VARCHAR:
  case BLOB:
  case INTERVAL:
  case TIMESTAMP_TZ|SQLNULL:
  case TIME_TZ|SQLNULL:
  case BIT:
  case STRING_LITERAL:
  case INTEGER_LITERAL:
  case 0x28:
  case 0x29:
  case TIMESTAMP_TZ|BOOLEAN:
  case TIMESTAMP_TZ|TINYINT:
  case TIMESTAMP_TZ|SMALLINT:
  case TIMESTAMP_TZ|INTEGER:
  case TIMESTAMP_TZ|BIGINT:
  case TIMESTAMP_TZ|DATE:
  case TIMESTAMP_TZ|TIME:
  case POINTER:
  case TIMESTAMP_TZ|TIMESTAMP_NS:
  case VALIDITY:
switchD_0132006f_caseD_2:
    this = (InvalidTypeException *)__cxa_allocate_exception(0x10);
    local_70.type_._0_8_ =
         &local_70.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"MinimumValue requires numeric type","");
    InvalidTypeException::InvalidTypeException(this,type,(string *)&local_70);
    __cxa_throw(this,&InvalidTypeException::typeinfo,::std::runtime_error::~runtime_error);
  case BOOLEAN:
    BOOLEAN(__return_storage_ptr__,false);
    break;
  case TINYINT:
    TINYINT(__return_storage_ptr__,-0x80);
    break;
  case SMALLINT:
    SMALLINT(__return_storage_ptr__,-0x8000);
    break;
  case BIGINT:
    BIGINT(__return_storage_ptr__,-0x8000000000000000);
    break;
  case DATE:
    dVar5 = Date::FromDate(-0x59af89,6,0x19);
    DATE(__return_storage_ptr__,dVar5);
    break;
  case TIME:
    TIME(__return_storage_ptr__,(dtime_t)0x0);
    break;
  case TIMESTAMP_SEC:
    LogicalType::LogicalType(&local_88,TIMESTAMP);
    MinimumValue(&local_70,&local_88);
    tVar6 = GetValueInternal<duckdb::timestamp_t>(&local_70);
    ~Value(&local_70);
    LogicalType::~LogicalType(&local_88);
    bVar4 = TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_sec_t>
                      (tVar6,(timestamp_sec_t *)&local_88,false);
    if (!bVar4) {
      auVar7 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_sec_t>
                ((string *)&local_70,(duckdb *)tVar6.value,(timestamp_t)auVar7._8_8_);
      InvalidInputException::InvalidInputException(auVar7._0_8_,(string *)&local_70);
      __cxa_throw(auVar7._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    TIMESTAMPSEC(__return_storage_ptr__,(timestamp_sec_t)local_88._0_8_);
    break;
  case TIMESTAMP_MS:
    LogicalType::LogicalType(&local_88,TIMESTAMP);
    MinimumValue(&local_70,&local_88);
    tVar6 = GetValueInternal<duckdb::timestamp_t>(&local_70);
    ~Value(&local_70);
    LogicalType::~LogicalType(&local_88);
    bVar4 = TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_ms_t>
                      (tVar6,(timestamp_ms_t *)&local_88,false);
    if (!bVar4) {
      auVar7 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_ms_t>
                ((string *)&local_70,(duckdb *)tVar6.value,(timestamp_t)auVar7._8_8_);
      InvalidInputException::InvalidInputException(auVar7._0_8_,(string *)&local_70);
      __cxa_throw(auVar7._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    TIMESTAMPMS(__return_storage_ptr__,(timestamp_ms_t)local_88._0_8_);
    break;
  case TIMESTAMP:
    dVar5 = Date::FromDate(-0x46e04,0xc,0x16);
    tVar6 = Timestamp::FromDatetime(dVar5,(dtime_t)0x0);
    TIMESTAMP(__return_storage_ptr__,tVar6);
    break;
  case TIMESTAMP_NS:
    TIMESTAMPNS(__return_storage_ptr__,(timestamp_ns_t)0x80004de2e24f0000);
    break;
  case DECIMAL:
    width = DecimalType::GetWidth(type);
    scale = DecimalType::GetScale(type);
    PVar1 = type->physical_type_;
    if (PVar1 < INT64) {
      if (PVar1 == INT16) {
        value_00 = (int64_t)(short)(1 - *(short *)(NumericHelper::POWERS_OF_TEN + (ulong)width * 8))
        ;
      }
      else {
        if (PVar1 != INT32) goto LAB_0132055a;
        value_00 = (int64_t)(1 - *(int *)(NumericHelper::POWERS_OF_TEN + (ulong)width * 8));
      }
    }
    else {
      if (PVar1 != INT64) {
        if (PVar1 == INT128) {
          lVar2 = *(long *)(Hugeint::POWERS_OF_TEN + (ulong)width * 0x10);
          uVar3 = *(ulong *)(Hugeint::POWERS_OF_TEN + (ulong)width * 0x10 + 8);
          hugeint_t::hugeint_t((hugeint_t *)&local_70,1);
          value_03.lower = local_70.type_._0_8_ - lVar2;
          value_03.upper =
               (long)&(local_70.type_.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->_vptr_ExtraTypeInfo +
               (ulong)(value_03.lower < (ulong)-lVar2) + ~uVar3 + (ulong)(lVar2 == 0);
          DECIMAL(__return_storage_ptr__,value_03,width,scale);
          return __return_storage_ptr__;
        }
LAB_0132055a:
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        local_70.type_._0_8_ =
             &local_70.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"Unknown decimal type","");
        InternalException::InternalException(this_00,(string *)&local_70);
        __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      value_00 = 1 - *(long *)(NumericHelper::POWERS_OF_TEN + (ulong)width * 8);
    }
    DECIMAL(__return_storage_ptr__,value_00,width,scale);
    break;
  case FLOAT:
    FLOAT(__return_storage_ptr__,-3.4028235e+38);
    break;
  case DOUBLE:
    DOUBLE(__return_storage_ptr__,-1.79769313486232e+308);
    break;
  case UTINYINT:
    UTINYINT(__return_storage_ptr__,'\0');
    break;
  case USMALLINT:
    USMALLINT(__return_storage_ptr__,0);
    break;
  case UINTEGER:
    UINTEGER(__return_storage_ptr__,0);
    break;
  case UBIGINT:
    UBIGINT(__return_storage_ptr__,0);
    break;
  case TIMESTAMP_TZ:
    dVar5 = Date::FromDate(-0x46e04,0xc,0x16);
    value.super_timestamp_t.value = Timestamp::FromDatetime(dVar5,(dtime_t)0x0);
    TIMESTAMPTZ(__return_storage_ptr__,value);
    break;
  case TIME_TZ:
    TIMETZ(__return_storage_ptr__,(dtime_tz_t)0x0);
    break;
  case VARINT:
    local_88.id_ = UUID;
    local_88.physical_type_ = BOOL;
    local_88._2_6_ = 0x3937312d0000;
    local_88.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x1e1ea6a;
    Varint::VarcharToVarInt_abi_cxx11_((string *)&local_70,(Varint *)&local_88,in_RDX);
    VARINT(__return_storage_ptr__,(string *)&local_70);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_70.type_._0_8_ !=
        &local_70.type_.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
      operator_delete((void *)local_70.type_._0_8_);
    }
    break;
  case UHUGEINT:
    UHUGEINT(__return_storage_ptr__,(Value *)0x0,(uhugeint_t)(ZEXT816(0x1e190b4) << 0x40));
    break;
  case HUGEINT:
    value_01.upper = (int64_t)&switchD_0132006f::switchdataD_01e190b4;
    value_01.lower = 0x8000000000000000;
    HUGEINT(__return_storage_ptr__,(Value *)0x0,value_01);
    break;
  case UUID:
    value_02.upper = (int64_t)&switchD_0132006f::switchdataD_01e190b4;
    value_02.lower = 0x8000000000000000;
    UUID(__return_storage_ptr__,(Value *)0x0,value_02);
    break;
  default:
    if (type->id_ != ENUM) goto switchD_0132006f_caseD_2;
    ENUM(__return_storage_ptr__,0,type);
  }
  return __return_storage_ptr__;
}

Assistant:

Value Value::MinimumValue(const LogicalType &type) {
	switch (type.id()) {
	case LogicalTypeId::BOOLEAN:
		return Value::BOOLEAN(false);
	case LogicalTypeId::TINYINT:
		return Value::TINYINT(NumericLimits<int8_t>::Minimum());
	case LogicalTypeId::SMALLINT:
		return Value::SMALLINT(NumericLimits<int16_t>::Minimum());
	case LogicalTypeId::INTEGER:
	case LogicalTypeId::SQLNULL:
		return Value::INTEGER(NumericLimits<int32_t>::Minimum());
	case LogicalTypeId::BIGINT:
		return Value::BIGINT(NumericLimits<int64_t>::Minimum());
	case LogicalTypeId::HUGEINT:
		return Value::HUGEINT(NumericLimits<hugeint_t>::Minimum());
	case LogicalTypeId::UHUGEINT:
		return Value::UHUGEINT(NumericLimits<uhugeint_t>::Minimum());
	case LogicalTypeId::UUID:
		return Value::UUID(NumericLimits<hugeint_t>::Minimum());
	case LogicalTypeId::UTINYINT:
		return Value::UTINYINT(NumericLimits<uint8_t>::Minimum());
	case LogicalTypeId::USMALLINT:
		return Value::USMALLINT(NumericLimits<uint16_t>::Minimum());
	case LogicalTypeId::UINTEGER:
		return Value::UINTEGER(NumericLimits<uint32_t>::Minimum());
	case LogicalTypeId::UBIGINT:
		return Value::UBIGINT(NumericLimits<uint64_t>::Minimum());
	case LogicalTypeId::DATE:
		return Value::DATE(Date::FromDate(Date::DATE_MIN_YEAR, Date::DATE_MIN_MONTH, Date::DATE_MIN_DAY));
	case LogicalTypeId::TIME:
		return Value::TIME(dtime_t(0));
	case LogicalTypeId::TIMESTAMP: {
		const auto date = Date::FromDate(Timestamp::MIN_YEAR, Timestamp::MIN_MONTH, Timestamp::MIN_DAY);
		return Value::TIMESTAMP(date, dtime_t(0));
	}
	case LogicalTypeId::TIMESTAMP_SEC: {
		// Get the minimum timestamp and cast it to timestamp_sec_t.
		const auto min_ts = MinimumValue(LogicalType::TIMESTAMP).GetValue<timestamp_t>();
		const auto ts = Cast::Operation<timestamp_t, timestamp_sec_t>(min_ts);
		return Value::TIMESTAMPSEC(ts);
	}
	case LogicalTypeId::TIMESTAMP_MS: {
		// Get the minimum timestamp and cast it to timestamp_ms_t.
		const auto min_ts = MinimumValue(LogicalType::TIMESTAMP).GetValue<timestamp_t>();
		const auto ts = Cast::Operation<timestamp_t, timestamp_ms_t>(min_ts);
		return Value::TIMESTAMPMS(ts);
	}
	case LogicalTypeId::TIMESTAMP_NS: {
		// Clear the fractional day.
		auto min_ns = NumericLimits<int64_t>::Minimum();
		min_ns /= Interval::NANOS_PER_DAY;
		min_ns *= Interval::NANOS_PER_DAY;
		return Value::TIMESTAMPNS(timestamp_ns_t(min_ns));
	}
	case LogicalTypeId::TIME_TZ:
		//	"00:00:00+1559" from the PG docs, but actually 00:00:00+15:59:59
		return Value::TIMETZ(dtime_tz_t(dtime_t(0), dtime_tz_t::MAX_OFFSET));
	case LogicalTypeId::TIMESTAMP_TZ: {
		const auto date = Date::FromDate(Timestamp::MIN_YEAR, Timestamp::MIN_MONTH, Timestamp::MIN_DAY);
		const auto ts = Timestamp::FromDatetime(date, dtime_t(0));
		return Value::TIMESTAMPTZ(timestamp_tz_t(ts));
	}
	case LogicalTypeId::FLOAT:
		return Value::FLOAT(NumericLimits<float>::Minimum());
	case LogicalTypeId::DOUBLE:
		return Value::DOUBLE(NumericLimits<double>::Minimum());
	case LogicalTypeId::DECIMAL: {
		auto width = DecimalType::GetWidth(type);
		auto scale = DecimalType::GetScale(type);
		switch (type.InternalType()) {
		case PhysicalType::INT16:
			return Value::DECIMAL(int16_t(-NumericHelper::POWERS_OF_TEN[width] + 1), width, scale);
		case PhysicalType::INT32:
			return Value::DECIMAL(int32_t(-NumericHelper::POWERS_OF_TEN[width] + 1), width, scale);
		case PhysicalType::INT64:
			return Value::DECIMAL(int64_t(-NumericHelper::POWERS_OF_TEN[width] + 1), width, scale);
		case PhysicalType::INT128:
			return Value::DECIMAL(-Hugeint::POWERS_OF_TEN[width] + 1, width, scale);
		default:
			throw InternalException("Unknown decimal type");
		}
	}
	case LogicalTypeId::ENUM:
		return Value::ENUM(0, type);
	case LogicalTypeId::VARINT:
		return Value::VARINT(Varint::VarcharToVarInt(
		    "-179769313486231570814527423731704356798070567525844996598917476803157260780028538760589558632766878171540"
		    "4589535143824642343213268894641827684675467035375169860499105765512820762454900903893289440758685084551339"
		    "42304583236903222948165808559332123348274797826204144723168738177180919299881250404026184124858368"));
	default:
		throw InvalidTypeException(type, "MinimumValue requires numeric type");
	}
}